

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.c
# Opt level: O2

int linear_expansion_sum_zeroelim(int elen,float *e,int flen,float *f,float *h)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  bool bVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  
  fVar10 = *e;
  fVar12 = *f;
  bVar8 = fVar10 < fVar12 == fVar12 <= -fVar10;
  if (bVar8) {
    fVar11 = f[1];
    fVar9 = fVar12;
  }
  else {
    fVar9 = fVar10;
    fVar10 = e[1];
    fVar11 = fVar12;
  }
  uVar7 = (ulong)!bVar8;
  uVar4 = (ulong)bVar8;
  uVar5 = (uint)!bVar8;
  if (((int)uVar5 < elen) && ((flen <= (int)(uint)bVar8 || (fVar10 < fVar11 != fVar11 <= -fVar10))))
  {
    fVar12 = fVar10 + fVar9;
    fVar13 = fVar12 - fVar10;
    uVar7 = (ulong)(uVar5 + 1);
    fVar10 = e[uVar7];
  }
  else {
    fVar12 = fVar11 + fVar9;
    fVar13 = fVar12 - fVar11;
    uVar4 = (ulong)(bVar8 + 1);
    fVar11 = f[uVar4];
  }
  fVar9 = fVar9 - fVar13;
  iVar1 = 0;
  for (iVar2 = 2; iVar2 < flen + elen; iVar2 = iVar2 + 1) {
    iVar6 = (int)uVar7;
    iVar3 = (int)uVar4;
    if ((iVar6 < elen) && ((flen <= iVar3 || (fVar10 < fVar11 != fVar11 <= -fVar10)))) {
      fVar13 = fVar9 + fVar10;
      fVar14 = fVar13 - fVar10;
      uVar7 = (ulong)(iVar6 + 1);
      fVar10 = e[(long)iVar6 + 1];
    }
    else {
      fVar13 = fVar9 + fVar11;
      fVar14 = fVar13 - fVar11;
      uVar4 = (ulong)(iVar3 + 1);
      fVar11 = f[(long)iVar3 + 1];
    }
    fVar9 = fVar9 - fVar14;
    if ((fVar9 != 0.0) || (NAN(fVar9))) {
      h[iVar1] = fVar9;
      iVar1 = iVar1 + 1;
    }
    fVar14 = fVar12 + fVar13;
    fVar9 = (fVar12 - (fVar14 - (fVar14 - fVar12))) + (fVar13 - (fVar14 - fVar12));
    fVar12 = fVar14;
  }
  if ((fVar9 != 0.0) || (iVar2 = iVar1, NAN(fVar9))) {
    iVar2 = iVar1 + 1;
    h[iVar1] = fVar9;
  }
  if (((fVar12 == 0.0) && (!NAN(fVar12))) && (iVar2 != 0)) {
    return iVar2;
  }
  h[iVar2] = fVar12;
  return iVar2 + 1;
}

Assistant:

int linear_expansion_sum_zeroelim(elen, e, flen, f, h)/* h cannot be e or f. */
int elen;
REAL *e;
int flen;
REAL *f;
REAL *h;
{
  REAL Q, q, hh;
  INEXACT REAL Qnew;
  INEXACT REAL R;
  INEXACT REAL bvirt;
  REAL avirt, bround, around;
  int eindex, findex, hindex;
  int count;
  REAL enow, fnow;
  REAL g0;

  enow = e[0];
  fnow = f[0];
  eindex = findex = 0;
  hindex = 0;
  if ((fnow > enow) == (fnow > -enow)) {
    g0 = enow;
    enow = e[++eindex];
  } else {
    g0 = fnow;
    fnow = f[++findex];
  }
  if ((eindex < elen) && ((findex >= flen)
                          || ((fnow > enow) == (fnow > -enow)))) {
    Fast_Two_Sum(enow, g0, Qnew, q);
    enow = e[++eindex];
  } else {
    Fast_Two_Sum(fnow, g0, Qnew, q);
    fnow = f[++findex];
  }
  Q = Qnew;
  for (count = 2; count < elen + flen; count++) {
    if ((eindex < elen) && ((findex >= flen)
                            || ((fnow > enow) == (fnow > -enow)))) {
      Fast_Two_Sum(enow, q, R, hh);
      enow = e[++eindex];
    } else {
      Fast_Two_Sum(fnow, q, R, hh);
      fnow = f[++findex];
    }
    Two_Sum(Q, R, Qnew, q);
    Q = Qnew;
    if (hh != 0) {
      h[hindex++] = hh;
    }
  }
  if (q != 0) {
    h[hindex++] = q;
  }
  if ((Q != 0.0) || (hindex == 0)) {
    h[hindex++] = Q;
  }
  return hindex;
}